

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular(GridAxisIrregular *this,KDataStream *stream)

{
  KDataStream *stream_local;
  GridAxisIrregular *this_local;
  
  GridAxisRegular::GridAxisRegular(&this->super_GridAxisRegular);
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_004f29a8;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vXiValues);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16Padding);
  (*(this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase[3])(this,stream);
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}